

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

WebPIDecoder *
WebPINewRGB(WEBP_CSP_MODE csp,uint8_t *output_buffer,size_t output_buffer_size,int output_stride)

{
  int in_ECX;
  size_t in_RDX;
  uint8_t *in_RSI;
  WEBP_CSP_MODE in_EDI;
  WebPIDecoder *idec;
  int is_external_memory;
  int local_24;
  size_t local_20;
  WebPIDecoder *local_8;
  
  if (in_EDI < MODE_YUV) {
    if ((in_RSI != (uint8_t *)0x0) == 0) {
      local_20 = 0;
      local_24 = 0;
    }
    else if ((in_ECX == 0) || (local_24 = in_ECX, local_20 = in_RDX, in_RDX == 0)) {
      return (WebPIDecoder *)0x0;
    }
    local_8 = WebPINewDecoder((WebPDecBuffer *)0x109f11);
    if (local_8 == (WebPIDecoder *)0x0) {
      local_8 = (WebPIDecoder *)0x0;
    }
    else {
      (local_8->output).colorspace = in_EDI;
      (local_8->output).is_external_memory = (uint)(in_RSI != (uint8_t *)0x0);
      (local_8->output).u.RGBA.rgba = in_RSI;
      (local_8->output).u.RGBA.stride = local_24;
      (local_8->output).u.RGBA.size = local_20;
    }
  }
  else {
    local_8 = (WebPIDecoder *)0x0;
  }
  return local_8;
}

Assistant:

WebPIDecoder* WebPINewRGB(WEBP_CSP_MODE csp, uint8_t* output_buffer,
                          size_t output_buffer_size, int output_stride) {
  const int is_external_memory = (output_buffer != NULL) ? 1 : 0;
  WebPIDecoder* idec;

  if (csp >= MODE_YUV) return NULL;
  if (is_external_memory == 0) {    // Overwrite parameters to sane values.
    output_buffer_size = 0;
    output_stride = 0;
  } else {  // A buffer was passed. Validate the other params.
    if (output_stride == 0 || output_buffer_size == 0) {
      return NULL;   // invalid parameter.
    }
  }
  idec = WebPINewDecoder(NULL);
  if (idec == NULL) return NULL;
  idec->output.colorspace = csp;
  idec->output.is_external_memory = is_external_memory;
  idec->output.u.RGBA.rgba = output_buffer;
  idec->output.u.RGBA.stride = output_stride;
  idec->output.u.RGBA.size = output_buffer_size;
  return idec;
}